

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

compare_eq_result_container<QList<QPersistentModelIndex>,_QPersistentModelIndex> __thiscall
QList<QPersistentModelIndex>::operator==
          (QList<QPersistentModelIndex> *this,QList<QPersistentModelIndex> *other)

{
  bool bVar1;
  QPersistentModelIndex *lhs;
  QPersistentModelIndex *rhs;
  long lVar2;
  
  lVar2 = (this->d).size;
  if (lVar2 != (other->d).size) {
    return false;
  }
  lhs = (this->d).ptr;
  rhs = (other->d).ptr;
  bVar1 = true;
  if ((lhs != rhs) && (lVar2 != 0)) {
    lVar2 = lVar2 * 8;
    do {
      lVar2 = lVar2 + -8;
      bVar1 = ::comparesEqual(lhs,rhs);
      if (!bVar1) {
        return bVar1;
      }
      lhs = lhs + 1;
      rhs = rhs + 1;
    } while (lVar2 != 0);
  }
  return bVar1;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }